

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O3

int Sle_ManComputeDelayOne(Gia_Man_t *p,int iObj,Vec_Int_t *vCuts,Vec_Int_t *vTime)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint *puVar6;
  
  if (-1 < iObj) {
    if (iObj < vCuts->nSize) {
      piVar1 = vCuts->pArray;
      lVar3 = (long)piVar1[(uint)iObj];
      if ((lVar3 < 0) || ((uint)vCuts->nSize <= (uint)piVar1[(uint)iObj])) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      if (piVar1[lVar3] < 1) {
        iVar5 = 1000000000;
      }
      else {
        iVar5 = 1000000000;
        iVar4 = 0;
        puVar6 = (uint *)(piVar1 + lVar3);
        do {
          puVar6 = puVar6 + 1;
          iVar2 = Sle_ManComputeDelayCut(p,(int *)puVar6,vTime);
          if (iVar2 <= iVar5) {
            iVar5 = iVar2;
          }
          iVar4 = iVar4 + 1;
          puVar6 = puVar6 + (*puVar6 & 0xf);
        } while (iVar4 < piVar1[lVar3]);
      }
      if (vTime->nSize <= iObj) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vTime->pArray[(uint)iObj] = iVar5;
      return iVar5;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Sle_ManComputeDelayOne( Gia_Man_t * p, int iObj, Vec_Int_t * vCuts, Vec_Int_t * vTime )
{
    int i, * pCut, Delay, DelayMin = ABC_INFINITY;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        Delay = Sle_ManComputeDelayCut( p, pCut, vTime );
        DelayMin = Abc_MinInt( DelayMin, Delay );
    }
    Vec_IntWriteEntry( vTime, iObj, DelayMin );
    return DelayMin;
}